

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error get_min_distance_line(SDF_Edge *line,FT_26D6_Vec point,SDF_Signed_Distance *out)

{
  long lVar1;
  long lVar2;
  int b_00;
  FT_Char FVar3;
  FT_Int32 FVar4;
  FT_Int32 FVar5;
  long lVar6;
  FT_Long FVar7;
  FT_Fixed FVar8;
  undefined1 local_b0 [8];
  FT_16D16_Vec nearest_vector;
  FT_16D16_Vec nearest_point;
  int local_88;
  FT_26D6 cross;
  FT_16D16 factor;
  FT_26D6 sq_line_length;
  FT_26D6_Vec p_sub_a;
  FT_26D6_Vec line_segment;
  FT_Vector p;
  FT_Vector b;
  FT_Vector a;
  FT_Error error;
  SDF_Signed_Distance *out_local;
  SDF_Edge *line_local;
  FT_26D6_Vec point_local;
  
  a.y._4_4_ = 0;
  if ((line == (SDF_Edge *)0x0) || (out == (SDF_Signed_Distance *)0x0)) {
    a.y._4_4_ = 6;
  }
  else if (line->edge_type == SDF_EDGE_LINE) {
    lVar1 = (line->start_pos).x;
    lVar2 = (line->start_pos).y;
    p_sub_a.y = (line->end_pos).x - lVar1;
    lVar6 = (line->end_pos).y - lVar2;
    p_sub_a.x = point.y - lVar2;
    FVar7 = FT_DivFix((long)((int)(((point.x - lVar1) * p_sub_a.y) / 0x40) +
                            (int)((p_sub_a.x * lVar6) / 0x40)),
                      (long)((int)((p_sub_a.y * p_sub_a.y) / 0x40) + (int)((lVar6 * lVar6) / 0x40)))
    ;
    local_88 = (int)FVar7;
    if (0x10000 < local_88) {
      local_88 = 0x10000;
    }
    if (local_88 < 0) {
      local_88 = 0;
    }
    FVar4 = FT_MulFix_x86_64((FT_Int32)(p_sub_a.y << 10),local_88);
    nearest_vector.y = (FT_Pos)FVar4;
    b_00 = (int)lVar6;
    FVar4 = FT_MulFix_x86_64(b_00 * 0x400,local_88);
    nearest_vector.y = lVar1 * 0x400 + nearest_vector.y;
    local_b0 = (undefined1  [8])(nearest_vector.y + point.x * -0x400);
    nearest_vector.x = lVar2 * 0x400 + (long)FVar4 + point.y * -0x400;
    FVar4 = FT_MulFix_x86_64(SUB84(local_b0,0),b_00);
    FVar5 = FT_MulFix_x86_64((FT_Int32)nearest_vector.x,(FT_Int32)p_sub_a.y);
    FVar3 = -1;
    if (FVar4 - FVar5 < 0) {
      FVar3 = '\x01';
    }
    out->sign = FVar3;
    FVar8 = FT_Vector_Length((FT_Vector *)local_b0);
    out->distance = (FT_16D16)FVar8;
    if ((local_88 == 0) || (local_88 == 0x10000)) {
      FT_Vector_NormLen((FT_Vector *)&p_sub_a.y);
      FT_Vector_NormLen((FT_Vector *)local_b0);
      FVar4 = FT_MulFix_x86_64((FT_Int32)p_sub_a.y,(FT_Int32)nearest_vector.x);
      FVar5 = FT_MulFix_x86_64(b_00,local_b0._0_4_);
      out->cross = FVar4 - FVar5;
    }
    else {
      out->cross = 0x10000;
    }
  }
  else {
    a.y._4_4_ = 6;
  }
  return a.y._4_4_;
}

Assistant:

static FT_Error
  get_min_distance_line( SDF_Edge*             line,
                         FT_26D6_Vec           point,
                         SDF_Signed_Distance*  out )
  {
    /*
     * In order to calculate the shortest distance from a point to
     * a line segment, we do the following.  Let's assume that
     *
     * ```
     * a = start point of the line segment
     * b = end point of the line segment
     * p = point from which shortest distance is to be calculated
     * ```
     *
     * (1) Write the parametric equation of the line.
     *
     *     ```
     *     point_on_line = a + (b - a) * t   (t is the factor)
     *     ```
     *
     * (2) Find the projection of point `p` on the line.  The projection
     *     will be perpendicular to the line, which allows us to get the
     *     solution by making the dot product zero.
     *
     *     ```
     *     (point_on_line - a) . (p - point_on_line) = 0
     *
     *                (point_on_line)
     *      (a) x-------o----------------x (b)
     *                |_|
     *                  |
     *                  |
     *                 (p)
     *     ```
     *
     * (3) Simplification of the above equation yields the factor of
     *     `point_on_line`:
     *
     *     ```
     *     t = ((p - a) . (b - a)) / |b - a|^2
     *     ```
     *
     * (4) We clamp factor `t` between [0.0f, 1.0f] because `point_on_line`
     *     can be outside of the line segment:
     *
     *     ```
     *                                          (point_on_line)
     *     (a) x------------------------x (b) -----o---
     *                                           |_|
     *                                             |
     *                                             |
     *                                            (p)
     *     ```
     *
     * (5) Finally, the distance we are interested in is
     *
     *     ```
     *     |point_on_line - p|
     *     ```
     */

    FT_Error  error = FT_Err_Ok;

    FT_Vector  a;                   /* start position */
    FT_Vector  b;                   /* end position   */
    FT_Vector  p;                   /* current point  */

    FT_26D6_Vec  line_segment;      /* `b` - `a` */
    FT_26D6_Vec  p_sub_a;           /* `p` - `a` */

    FT_26D6   sq_line_length;       /* squared length of `line_segment` */
    FT_16D16  factor;               /* factor of the nearest point      */
    FT_26D6   cross;                /* used to determine sign           */

    FT_16D16_Vec  nearest_point;    /* `point_on_line`       */
    FT_16D16_Vec  nearest_vector;   /* `p` - `nearest_point` */


    if ( !line || !out )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( line->edge_type != SDF_EDGE_LINE )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    a = line->start_pos;
    b = line->end_pos;
    p = point;

    line_segment.x = b.x - a.x;
    line_segment.y = b.y - a.y;

    p_sub_a.x = p.x - a.x;
    p_sub_a.y = p.y - a.y;

    sq_line_length = ( line_segment.x * line_segment.x ) / 64 +
                     ( line_segment.y * line_segment.y ) / 64;

    /* currently factor is 26.6 */
    factor = ( p_sub_a.x * line_segment.x ) / 64 +
             ( p_sub_a.y * line_segment.y ) / 64;

    /* now factor is 16.16 */
    factor = FT_DivFix( factor, sq_line_length );

    /* clamp the factor between 0.0 and 1.0 in fixed-point */
    if ( factor > FT_INT_16D16( 1 ) )
      factor = FT_INT_16D16( 1 );
    if ( factor < 0 )
      factor = 0;

    nearest_point.x = FT_MulFix( FT_26D6_16D16( line_segment.x ),
                                 factor );
    nearest_point.y = FT_MulFix( FT_26D6_16D16( line_segment.y ),
                                 factor );

    nearest_point.x = FT_26D6_16D16( a.x ) + nearest_point.x;
    nearest_point.y = FT_26D6_16D16( a.y ) + nearest_point.y;

    nearest_vector.x = nearest_point.x - FT_26D6_16D16( p.x );
    nearest_vector.y = nearest_point.y - FT_26D6_16D16( p.y );

    cross = FT_MulFix( nearest_vector.x, line_segment.y ) -
            FT_MulFix( nearest_vector.y, line_segment.x );

    /* assign the output */
    out->sign     = cross < 0 ? 1 : -1;
    out->distance = VECTOR_LENGTH_16D16( nearest_vector );

    /* Instead of finding `cross` for checking corner we */
    /* directly set it here.  This is more efficient     */
    /* because if the distance is perpendicular we can   */
    /* directly set it to 1.                             */
    if ( factor != 0 && factor != FT_INT_16D16( 1 ) )
      out->cross = FT_INT_16D16( 1 );
    else
    {
      /* [OPTIMIZATION]: Pre-compute this direction. */
      /* If not perpendicular then compute `cross`.  */
      FT_Vector_NormLen( &line_segment );
      FT_Vector_NormLen( &nearest_vector );

      out->cross = FT_MulFix( line_segment.x, nearest_vector.y ) -
                   FT_MulFix( line_segment.y, nearest_vector.x );
    }

  Exit:
    return error;
  }